

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt-save.c
# Opt level: O1

ztresult_t savestack_push(save_stack_t *stack,savestack_entry_t *entry)

{
  uint uVar1;
  int iVar2;
  savestack_entry_t *psVar3;
  ulong uVar4;
  
  if (stack->sp == stack->stack + stack->allocated) {
    uVar1 = stack->allocated * 2;
    uVar4 = 4;
    if (4 < (int)uVar1) {
      uVar4 = (ulong)uVar1;
    }
    psVar3 = (savestack_entry_t *)realloc(stack->stack,uVar4 * 0xc);
    if (psVar3 == (savestack_entry_t *)0x0) {
      return 0x10;
    }
    stack->sp = (savestack_entry_t *)(((long)stack->sp - (long)stack->stack) + (long)psVar3);
    stack->stack = psVar3;
    stack->allocated = (int)uVar4;
  }
  psVar3 = stack->sp;
  stack->sp = psVar3 + 1;
  psVar3->index = entry->index;
  iVar2 = entry->nelems;
  psVar3->container = entry->container;
  psVar3->nelems = iVar2;
  return 0;
}

Assistant:

static ztresult_t savestack_push(save_stack_t      *stack,
                           const savestack_entry_t *entry)
{
  const int InitialStackSize      = 4; /* initial size in entries */
  const int StackGrowthMultiplier = 2; /* doubling strategy */

  if (stack->sp == stack->stack + stack->allocated)
  {
    int                newallocated;
    savestack_entry_t *newstack;

    newallocated = stack->allocated * StackGrowthMultiplier;
    if (newallocated < InitialStackSize)
      newallocated = InitialStackSize;

    newstack = realloc(stack->stack, newallocated * sizeof(*newstack)); /* FIXME: hoist to a memory manager */
    if (newstack == NULL)
      return ztresult_OOM;

    stack->sp        = newstack + (stack->sp - stack->stack); /* adjust sp */
    stack->stack     = newstack;
    stack->allocated = newallocated;
  }

  *stack->sp++ = *entry;

  return ztresult_OK;
}